

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O2

void __thiscall
SimpleWeb::ServerBase<asio::basic_stream_socket<asio::ip::tcp>_>::~ServerBase
          (ServerBase<asio::basic_stream_socket<asio::ip::tcp>_> *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~ServerBase() noexcept {
      handler_runner->stop();
      stop();
    }